

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsPtr xmlNewReconciledNs(xmlNodePtr tree,xmlNsPtr ns)

{
  int iVar1;
  xmlNsPtr pxVar2;
  int local_6c;
  int res;
  int counter;
  xmlChar prefix [50];
  xmlNodePtr local_28;
  xmlNsPtr def;
  xmlNsPtr ns_local;
  xmlNodePtr tree_local;
  
  local_6c = 1;
  if ((tree == (xmlNodePtr)0x0) || (tree->type != XML_ELEMENT_NODE)) {
    tree_local = (xmlNodePtr)0x0;
  }
  else if ((ns == (xmlNsPtr)0x0) || (ns->type != XML_NAMESPACE_DECL)) {
    tree_local = (xmlNodePtr)0x0;
  }
  else {
    def = ns;
    ns_local = (xmlNsPtr)tree;
    iVar1 = xmlSearchNsByHrefSafe(tree,ns->href,(xmlNsPtr *)&local_28);
    if (iVar1 < 0) {
      tree_local = (xmlNodePtr)0x0;
    }
    else if (local_28 == (xmlNodePtr)0x0) {
      if (def->prefix == (xmlChar *)0x0) {
        snprintf((char *)&res,0x32,"default");
      }
      else {
        snprintf((char *)&res,0x32,"%.20s",def->prefix);
      }
      iVar1 = xmlSearchNsSafe((xmlNodePtr)ns_local,(xmlChar *)&res,(xmlNsPtr *)&local_28);
      if (iVar1 < 0) {
        tree_local = (xmlNodePtr)0x0;
      }
      else {
        do {
          if (local_28 == (xmlNodePtr)0x0) {
            pxVar2 = xmlNewNs((xmlNodePtr)ns_local,def->href,(xmlChar *)&res);
            return pxVar2;
          }
          if (1000 < local_6c) {
            return (xmlNsPtr)0x0;
          }
          if (def->prefix == (xmlChar *)0x0) {
            snprintf((char *)&res,0x32,"default%d");
          }
          else {
            snprintf((char *)&res,0x32,"%.20s%d",def->prefix);
          }
          local_6c = local_6c + 1;
          iVar1 = xmlSearchNsSafe((xmlNodePtr)ns_local,(xmlChar *)&res,(xmlNsPtr *)&local_28);
        } while (-1 < iVar1);
        tree_local = (xmlNodePtr)0x0;
      }
    }
    else {
      tree_local = local_28;
    }
  }
  return (xmlNsPtr)tree_local;
}

Assistant:

static xmlNsPtr
xmlNewReconciledNs(xmlNodePtr tree, xmlNsPtr ns) {
    xmlNsPtr def;
    xmlChar prefix[50];
    int counter = 1;
    int res;

    if ((tree == NULL) || (tree->type != XML_ELEMENT_NODE)) {
	return(NULL);
    }
    if ((ns == NULL) || (ns->type != XML_NAMESPACE_DECL)) {
	return(NULL);
    }
    /*
     * Search an existing namespace definition inherited.
     */
    res = xmlSearchNsByHrefSafe(tree, ns->href, &def);
    if (res < 0)
        return(NULL);
    if (def != NULL)
        return(def);

    /*
     * Find a close prefix which is not already in use.
     * Let's strip namespace prefixes longer than 20 chars !
     */
    if (ns->prefix == NULL)
	snprintf((char *) prefix, sizeof(prefix), "default");
    else
	snprintf((char *) prefix, sizeof(prefix), "%.20s", (char *)ns->prefix);

    res = xmlSearchNsSafe(tree, prefix, &def);
    if (res < 0)
        return(NULL);
    while (def != NULL) {
        if (counter > 1000) return(NULL);
	if (ns->prefix == NULL)
	    snprintf((char *) prefix, sizeof(prefix), "default%d", counter++);
	else
	    snprintf((char *) prefix, sizeof(prefix), "%.20s%d",
		(char *)ns->prefix, counter++);
	res = xmlSearchNsSafe(tree, prefix, &def);
        if (res < 0)
            return(NULL);
    }

    /*
     * OK, now we are ready to create a new one.
     */
    def = xmlNewNs(tree, ns->href, prefix);
    return(def);
}